

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serializer.cpp
# Opt level: O2

FSerializer * Serialize(FSerializer *arc,char *key,DObject **value,DObject **param_4,bool *retcode)

{
  ushort uVar1;
  FWriter *this;
  PClass *key_00;
  uint uVar2;
  uint *puVar3;
  Value *this_00;
  Node *pNVar4;
  ClassReg *pCVar5;
  int ndx;
  uint local_2c;
  
  if (retcode != (bool *)0x0) {
    *retcode = true;
  }
  this = arc->w;
  if (this != (FWriter *)0x0) {
    key_00 = (PClass *)*value;
    if (key_00 != (PClass *)0x0) {
      if (key_00 == AWeapon::RegistrationInfo.MyClass) {
        local_2c = 0xffffffff;
      }
      else {
        if ((*(ushort *)
              ((long)&(key_00->super_PNativeStruct).super_PStruct.super_PNamedType.
                      super_PCompoundType.super_PType.super_PTypeBase.super_DObject + 0x20) & 0x820)
            != 0) {
          return arc;
        }
        puVar3 = (uint *)TMap<DObject_*,_int,_THashTraits<DObject_*>,_TValueTraits<int>_>::CheckKey
                                   (&this->mObjectMap,(DObject *)key_00);
        if (puVar3 == (uint *)0x0) {
          uVar2 = TArray<DObject_*,_DObject_*>::Push(&arc->w->mDObjects,value);
          local_2c = uVar2;
          pNVar4 = TMap<DObject_*,_int,_THashTraits<DObject_*>,_TValueTraits<int>_>::GetNode
                             (&arc->w->mObjectMap,*value);
          (pNVar4->Pair).Value = uVar2;
        }
        else {
          local_2c = *puVar3;
        }
      }
      Serialize(arc,key,(int32_t *)&local_2c,(int32_t *)0x0);
      return arc;
    }
    uVar2 = (this->mInObject).Count;
    if ((uVar2 != 0) && ((this->mInObject).Array[uVar2 - 1] != false)) {
      return arc;
    }
    FWriter::Null(this);
    return arc;
  }
  if (arc->r->mObjectsRead == false) {
    __assert_fail("false && \"Attempt to read object reference without calling ReadObjects first\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/serializer.cpp"
                  ,0x657,
                  "FSerializer &Serialize(FSerializer &, const char *, DObject *&, DObject **, bool *)"
                 );
  }
  this_00 = FReader::FindKey(arc->r,key);
  if (this_00 != (Value *)0x0) {
    uVar1 = (this_00->data_).f.flags;
    if (uVar1 == 0) goto LAB_0047362e;
    if ((uVar1 & 0x20) != 0) {
      uVar2 = rapidjson::
              GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              ::GetInt(this_00);
      if (uVar2 == 0xffffffff) {
        pCVar5 = &AWeapon::RegistrationInfo;
      }
      else {
        if (((int)uVar2 < 0) || ((int)(arc->r->mDObjects).Count <= (int)uVar2)) {
          __assert_fail("index >= 0 && index < (int)arc.r->mDObjects.Size()",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/serializer.cpp"
                        ,0x66b,
                        "FSerializer &Serialize(FSerializer &, const char *, DObject *&, DObject **, bool *)"
                       );
        }
        pCVar5 = (ClassReg *)((arc->r->mDObjects).Array + uVar2);
      }
      *value = (DObject *)pCVar5->MyClass;
      return arc;
    }
  }
  if (retcode != (bool *)0x0) {
    *retcode = false;
    return arc;
  }
LAB_0047362e:
  *value = (DObject *)0x0;
  return arc;
}

Assistant:

FSerializer &Serialize(FSerializer &arc, const char *key, DObject *&value, DObject ** /*defval*/, bool *retcode)
{
	if (retcode) *retcode = true;
	if (arc.isWriting())
	{
		if (value != nullptr)
		{
			int ndx;
			if (value == WP_NOCHANGE)
			{
				ndx = -1;
			}
			else if (value->ObjectFlags & (OF_EuthanizeMe | OF_Transient))
			{
				return arc;
			}
			else
			{
				int *pndx = arc.w->mObjectMap.CheckKey(value);
				if (pndx != nullptr)
				{
					ndx = *pndx;
				}
				else
				{
					ndx = arc.w->mDObjects.Push(value);
					arc.w->mObjectMap[value] = ndx;
				}
			}
			Serialize(arc, key, ndx, nullptr);
		}
		else if (!arc.w->inObject())
		{
			arc.w->Null();
		}
	}
	else
	{
		if (!arc.r->mObjectsRead)
		{
			// If you want to read objects, you MUST call ReadObjects first, even if there's only nullptr's.
			assert(false && "Attempt to read object reference without calling ReadObjects first");
			I_Error("Attempt to read object reference without calling ReadObjects first");
		}
		auto val = arc.r->FindKey(key);
		if (val != nullptr)
		{
			if (val->IsNull())
			{
				value = nullptr;
				return arc;
			}
			else if (val->IsInt())
			{
				int index = val->GetInt();
				if (index == -1)
				{
					value = WP_NOCHANGE;
				}
				else
				{
					assert(index >= 0 && index < (int)arc.r->mDObjects.Size());
					if (index >= 0 && index < (int)arc.r->mDObjects.Size())
					{
						value = arc.r->mDObjects[index];
					}
					else
					{
						assert(false && "invalid object reference");
						Printf(TEXTCOLOR_RED "Invalid object reference for '%s'", key);
						value = nullptr;
						arc.mErrors++;
						if (retcode) *retcode = false;
					}
				}
				return arc;
			}
		}
		if (!retcode)
		{
			value = nullptr;
		}
		else
		{
			*retcode = false;
		}
	}
	return arc;
}